

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

int __thiscall
soplex::SPxSteepPR<double>::buildBestPriceVectorLeave(SPxSteepPR<double> *this,double feastol)

{
  pointer *ppIVar1;
  double dVar2;
  double dVar3;
  SPxSolverBase<double> *pSVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pIVar7;
  iterator __position;
  IdxElement *keys;
  uint uVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  IdxElement price;
  
  pSVar4 = (this->super_SPxPricer<double>).thesolver;
  pdVar5 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pSVar4->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar7 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar7) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar10 = (long)(pSVar4->infeasibilities).super_IdxSet.num;
  if (0 < lVar10) {
    lVar10 = lVar10 + 1;
    do {
      pSVar4 = (this->super_SPxPricer<double>).thesolver;
      iVar9 = (pSVar4->infeasibilities).super_IdxSet.idx[lVar10 + -2];
      dVar2 = pdVar5[iVar9];
      if (dVar2 < -feastol) {
        (pSVar4->isInfeasible).data[iVar9] = 1;
        dVar3 = pdVar6[iVar9];
        dVar11 = feastol;
        if (feastol <= dVar3) {
          dVar11 = dVar3;
        }
        price.val = (dVar2 * dVar2) / dVar11;
        __position._M_current =
             (this->prices).data.
             super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        price.idx = iVar9;
        if (__position._M_current ==
            (this->prices).data.
            super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<soplex::SPxPricer<double>::IdxElement,std::allocator<soplex::SPxPricer<double>::IdxElement>>
          ::_M_realloc_insert<soplex::SPxPricer<double>::IdxElement_const&>
                    ((vector<soplex::SPxPricer<double>::IdxElement,std::allocator<soplex::SPxPricer<double>::IdxElement>>
                      *)&this->prices,__position,&price);
        }
        else {
          *(ulong *)__position._M_current = CONCAT44(price._4_4_,iVar9);
          (__position._M_current)->val = price.val;
          ppIVar1 = &(this->prices).data.
                     super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
      }
      lVar10 = lVar10 + -1;
    } while (1 < lVar10);
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_SPxPricer<double>).compare.elements = keys;
  uVar8 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                    (keys,&(this->super_SPxPricer<double>).compare,0,
                     (int)((ulong)((long)pIVar7 - (long)keys) >> 4),100,0,0,true);
  if (0 < (int)uVar8) {
    lVar10 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,
                      *(int *)((long)&((this->prices).data.
                                       super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->idx + lVar10));
      (((this->super_SPxPricer<double>).thesolver)->isInfeasible).data
      [*(int *)((long)&((this->prices).data.
                        super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                        ._M_impl.super__Vector_impl_data._M_start)->idx + lVar10)] = 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)uVar8 << 4 != lVar10);
  }
  if ((int)uVar8 < 1) {
    iVar9 = -1;
  }
  else {
    iVar9 = ((this->prices).data.
             super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start)->idx;
  }
  return iVar9;
}

Assistant:

int SPxSteepPR<R>::buildBestPriceVectorLeave(R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, cpen[idx], feastol);
         price.idx = idx;
         prices.append(price);
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
      return prices[0].idx;
   else
      return -1;
}